

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall BigInt::quick_pow(BigInt *__return_storage_ptr__,BigInt *this,int power)

{
  BigInt res;
  BigInt local_38;
  
  if (power == 0) {
    BigInt(__return_storage_ptr__,1);
  }
  else {
    quick_pow(&res,this,power / 2);
    if ((power & 1U) == 0) {
      multiply(__return_storage_ptr__,&res,&res);
    }
    else {
      multiply(&local_38,&res,&res);
      multiply(__return_storage_ptr__,&local_38,this);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_38);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&res);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::quick_pow(int power) {
    if (power == 0)
    {
        return BigInt(1);
    }
    BigInt res = quick_pow(power/2);
    if (power%2)
    {
        return res*res*(*this);
    }
    else
    {
        return res*res;
    }
}